

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Args::run(Args *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  DynamicFormat *pDVar2;
  runtime_error *prVar3;
  path *__p;
  undefined1 auVar4 [16];
  byte local_311;
  Args local_2f8;
  string local_200;
  path local_1e0;
  path local_1b8;
  undefined1 local_190 [8];
  path path;
  directory_entry *entry;
  recursive_directory_iterator local_158;
  undefined1 local_148 [8];
  recursive_directory_iterator __end1;
  undefined1 local_128 [8];
  recursive_directory_iterator __begin1;
  recursive_directory_iterator local_f0;
  recursive_directory_iterator *local_e0;
  recursive_directory_iterator *__range1;
  char *local_d0;
  undefined1 local_c8 [8];
  string_view extension;
  string local_b0;
  string_view local_90;
  DynamicFormat *local_80;
  DynamicFormat *format;
  path local_70;
  path local_38;
  Args *local_10;
  Args *this_local;
  
  local_10 = this;
  if ((this->recursive & 1U) == 0) {
    run_once(this);
  }
  else {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_38,&this->input_dir,auto_format);
    format._7_1_ = 0;
    bVar1 = std::filesystem::exists(&local_38);
    local_311 = 1;
    if (bVar1) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_70,&this->input_dir,auto_format);
      format._7_1_ = 1;
      bVar1 = std::filesystem::is_directory(&local_70);
      local_311 = bVar1 ^ 0xff;
    }
    if ((format._7_1_ & 1) != 0) {
      std::filesystem::__cxx11::path::~path(&local_70);
    }
    std::filesystem::__cxx11::path::~path(&local_38);
    if ((local_311 & 1) != 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Input directory doesn\'t exist!");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&this->input_format);
    if (bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Recursive run needs input format!");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,"");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"",(allocator<char> *)((long)&extension._M_str + 7));
    pDVar2 = get_format(&this->input_format,local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&extension._M_str + 7));
    local_80 = pDVar2;
    if (pDVar2 == (DynamicFormat *)0x0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"No format found for recursive run!");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    auVar4 = (**(code **)(*(long *)pDVar2 + 0x10))();
    extension._M_len = auVar4._8_8_;
    local_c8 = auVar4._0_8_;
    auVar4 = (**(code **)(*(long *)local_80 + 0x10))();
    local_d0 = auVar4._8_8_;
    __range1 = auVar4._0_8_;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&__range1);
    if (bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Format must have default extension!");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = &__begin1._M_dirs._M_refcount;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)this_00,&this->input_dir,auto_format);
    std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
              (&local_f0,(path *)this_00);
    std::filesystem::__cxx11::path::~path((path *)&__begin1._M_dirs._M_refcount);
    local_e0 = &local_f0;
    std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
              ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount,local_e0);
    std::filesystem::__cxx11::begin
              ((__cxx11 *)local_128,(recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
    std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
              (&local_158,local_e0);
    std::filesystem::__cxx11::end((recursive_directory_iterator *)local_148);
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              (&local_158);
    while (bVar1 = std::filesystem::__cxx11::operator!=
                             ((recursive_directory_iterator *)local_128,
                              (recursive_directory_iterator *)local_148), bVar1) {
      path._32_8_ = std::filesystem::__cxx11::recursive_directory_iterator::operator*
                              ((recursive_directory_iterator *)local_128);
      bVar1 = std::filesystem::__cxx11::directory_entry::is_regular_file
                        ((directory_entry *)path._32_8_);
      if (bVar1) {
        __p = std::filesystem::__cxx11::directory_entry::path((directory_entry *)path._32_8_);
        std::filesystem::__cxx11::path::path((path *)local_190,__p);
        std::filesystem::__cxx11::path::extension(&local_1b8,(path *)local_190);
        std::filesystem::__cxx11::path::
        path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                  (&local_1e0,(basic_string_view<char,_std::char_traits<char>_> *)local_c8,
                   auto_format);
        bVar1 = std::filesystem::__cxx11::operator==(&local_1b8,&local_1e0);
        std::filesystem::__cxx11::path::~path(&local_1e0);
        std::filesystem::__cxx11::path::~path(&local_1b8);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::filesystem::__cxx11::path::generic_string(&local_200,(path *)local_190);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&this->input_file,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          Args(&local_2f8,this);
          run_once(&local_2f8);
          ~Args(&local_2f8);
        }
        std::filesystem::__cxx11::path::~path((path *)local_190);
      }
      std::filesystem::__cxx11::recursive_directory_iterator::operator++
                ((recursive_directory_iterator *)local_128);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)local_148);
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)local_128);
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_f0)
    ;
  }
  return;
}

Assistant:

void run() {
        if (!recursive) {
            return run_once();
        }

        if (!fs::exists(input_dir) || !fs::is_directory(input_dir)) {
            throw std::runtime_error("Input directory doesn't exist!");
        }

        if (input_format.empty()) {
            throw std::runtime_error("Recursive run needs input format!");
        }

        auto const format = get_format(input_format, "", "");
        if (!format) {
            throw std::runtime_error("No format found for recursive run!");
        }

        auto const extension = format->default_extension();
        if (format->default_extension().empty()) {
            throw std::runtime_error("Format must have default extension!");
        }

        for (auto const& entry: fs::recursive_directory_iterator(input_dir)) {
            if (!entry.is_regular_file()) {
                continue;
            }
            auto const path = entry.path();
            if (path.extension() != extension) {
                continue;
            }
            this->input_file = path.generic_string();
            Args {*this}.run_once();
        }
    }